

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t zeGetKernelProcAddrTable(ze_api_version_t version,ze_kernel_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_kernel_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((tracing_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
      DAT_0017f680 = pDdiTable->pfnCreate;
      pDdiTable->pfnCreate = tracing_layer::zeKernelCreate;
      DAT_0017f688 = pDdiTable->pfnDestroy;
      pDdiTable->pfnDestroy = tracing_layer::zeKernelDestroy;
      DAT_0017f690 = pDdiTable->pfnSetCacheConfig;
      pDdiTable->pfnSetCacheConfig = tracing_layer::zeKernelSetCacheConfig;
      DAT_0017f698 = pDdiTable->pfnSetGroupSize;
      pDdiTable->pfnSetGroupSize = tracing_layer::zeKernelSetGroupSize;
      DAT_0017f6a0 = pDdiTable->pfnSuggestGroupSize;
      pDdiTable->pfnSuggestGroupSize = tracing_layer::zeKernelSuggestGroupSize;
      DAT_0017f6a8 = pDdiTable->pfnSuggestMaxCooperativeGroupCount;
      pDdiTable->pfnSuggestMaxCooperativeGroupCount =
           tracing_layer::zeKernelSuggestMaxCooperativeGroupCount;
      DAT_0017f6b0 = pDdiTable->pfnSetArgumentValue;
      pDdiTable->pfnSetArgumentValue = tracing_layer::zeKernelSetArgumentValue;
      DAT_0017f6b8 = pDdiTable->pfnSetIndirectAccess;
      pDdiTable->pfnSetIndirectAccess = tracing_layer::zeKernelSetIndirectAccess;
      DAT_0017f6c0 = pDdiTable->pfnGetIndirectAccess;
      pDdiTable->pfnGetIndirectAccess = tracing_layer::zeKernelGetIndirectAccess;
      _DAT_0017f6c8 = pDdiTable->pfnGetSourceAttributes;
      pDdiTable->pfnGetSourceAttributes = tracing_layer::zeKernelGetSourceAttributes;
      DAT_0017f6d0 = pDdiTable->pfnGetProperties;
      pDdiTable->pfnGetProperties = tracing_layer::zeKernelGetProperties;
      DAT_0017f6d8 = pDdiTable->pfnGetName;
      pDdiTable->pfnGetName = tracing_layer::zeKernelGetName;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetKernelProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_kernel_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.Kernel;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = tracing_layer::zeKernelCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = tracing_layer::zeKernelDestroy;

    dditable.pfnSetCacheConfig                           = pDdiTable->pfnSetCacheConfig;
    pDdiTable->pfnSetCacheConfig                         = tracing_layer::zeKernelSetCacheConfig;

    dditable.pfnSetGroupSize                             = pDdiTable->pfnSetGroupSize;
    pDdiTable->pfnSetGroupSize                           = tracing_layer::zeKernelSetGroupSize;

    dditable.pfnSuggestGroupSize                         = pDdiTable->pfnSuggestGroupSize;
    pDdiTable->pfnSuggestGroupSize                       = tracing_layer::zeKernelSuggestGroupSize;

    dditable.pfnSuggestMaxCooperativeGroupCount          = pDdiTable->pfnSuggestMaxCooperativeGroupCount;
    pDdiTable->pfnSuggestMaxCooperativeGroupCount        = tracing_layer::zeKernelSuggestMaxCooperativeGroupCount;

    dditable.pfnSetArgumentValue                         = pDdiTable->pfnSetArgumentValue;
    pDdiTable->pfnSetArgumentValue                       = tracing_layer::zeKernelSetArgumentValue;

    dditable.pfnSetIndirectAccess                        = pDdiTable->pfnSetIndirectAccess;
    pDdiTable->pfnSetIndirectAccess                      = tracing_layer::zeKernelSetIndirectAccess;

    dditable.pfnGetIndirectAccess                        = pDdiTable->pfnGetIndirectAccess;
    pDdiTable->pfnGetIndirectAccess                      = tracing_layer::zeKernelGetIndirectAccess;

    dditable.pfnGetSourceAttributes                      = pDdiTable->pfnGetSourceAttributes;
    pDdiTable->pfnGetSourceAttributes                    = tracing_layer::zeKernelGetSourceAttributes;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = tracing_layer::zeKernelGetProperties;

    dditable.pfnGetName                                  = pDdiTable->pfnGetName;
    pDdiTable->pfnGetName                                = tracing_layer::zeKernelGetName;

    return result;
}